

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

size_t priRMTest_deep(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long in_RDI;
  size_t qr_deep;
  size_t in_stack_ffffffffffffffe0;
  
  sVar1 = zmCreate_deep(in_stack_ffffffffffffffe0);
  sVar2 = in_RDI << 4;
  sVar3 = zmCreate_keep(in_stack_ffffffffffffffe0);
  sVar3 = sVar2 + sVar3;
  sVar4 = prngCOMBO_keep();
  sVar2 = qrPower_deep(sVar1,sVar3,sVar2);
  sVar1 = utilMax(2,sVar1,sVar2);
  return sVar3 + sVar4 + sVar1;
}

Assistant:

size_t priRMTest_deep(size_t n)
{
	size_t qr_deep = zmCreate_deep(O_OF_W(n));
	return O_OF_W(2 * n) + zmCreate_keep(O_OF_W(n)) + prngCOMBO_keep() +
		utilMax(2,
			qr_deep,
			qrPower_deep(n, n, qr_deep));
}